

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * fmt::v11::detail::parse_precision<char>
                 (char *begin,char *end,format_specs *specs,arg_ref<char> *precision_ref,
                 parse_context<char> *ctx)

{
  parse_dynamic_spec_result<char> pVar1;
  parse_dynamic_spec_result<char> result;
  parse_context<char> *ctx_local;
  arg_ref<char> *precision_ref_local;
  format_specs *specs_local;
  char *end_local;
  char *begin_local;
  
  if (begin + 1 == end) {
    report_error("invalid precision");
  }
  pVar1 = parse_dynamic_spec<char>(begin + 1,end,&specs->precision,precision_ref,ctx);
  basic_specs::set_dynamic_precision(&specs->super_basic_specs,pVar1.kind);
  return pVar1.end;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   format_specs& specs,
                                   arg_ref<Char>& precision_ref,
                                   parse_context<Char>& ctx) -> const Char* {
  ++begin;
  if (begin == end) {
    report_error("invalid precision");
    return begin;
  }
  auto result =
      parse_dynamic_spec(begin, end, specs.precision, precision_ref, ctx);
  specs.set_dynamic_precision(result.kind);
  return result.end;
}